

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<8192,Blob<224>>
               (hashfunc<Blob<224>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  pfHash p_Var2;
  size_type sVar3;
  byte in_CL;
  byte in_DL;
  char *pcVar4;
  uint in_ESI;
  byte in_R8B;
  byte in_R9B;
  bool result;
  Blob<224> h;
  keytype k;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> hashes;
  undefined4 in_stack_fffffffffffffbac;
  byte bVar5;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *in_stack_fffffffffffffbb0;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *in_stack_fffffffffffffbc0;
  Blob<8192> *in_stack_fffffffffffffbc8;
  undefined1 in_stack_fffffffffffffbd7;
  int in_stack_fffffffffffffbd8;
  int in_stack_fffffffffffffbdc;
  pfHash in_stack_fffffffffffffbe0;
  uint8_t in_stack_fffffffffffffcbb;
  uint8_t in_stack_fffffffffffffcbc;
  uint8_t in_stack_fffffffffffffcbd;
  uint8_t in_stack_fffffffffffffcbe;
  uint8_t in_stack_fffffffffffffcbf;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *in_stack_fffffffffffffcc0;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [8];
  
  local_d = in_DL & 1;
  local_e = in_CL & 1;
  local_f = in_R8B & 1;
  local_10 = in_R9B & 1;
  pcVar4 = "exactly";
  if ((in_DL & 1) != 0) {
    pcVar4 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x2000,pcVar4,(ulong)in_ESI);
  std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::vector
            ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)0x184d4f);
  Blob<8192>::Blob((Blob<8192> *)&stack0xfffffffffffffbd8);
  memset(&stack0xfffffffffffffbd8,0,0x400);
  if ((local_d & 1) != 0) {
    Blob<224>::Blob((Blob<224> *)&stack0xfffffffffffffbb0);
    p_Var2 = hashfunc::operator_cast_to_function_pointer(local_8);
    (*p_Var2)(&stack0xfffffffffffffbd8,0x400,0,&stack0xfffffffffffffbb0);
    std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::push_back
              (in_stack_fffffffffffffbb0,(value_type *)CONCAT44(in_stack_fffffffffffffbac,in_ESI));
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<8192>,Blob<224>>
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8,
             (bool)in_stack_fffffffffffffbd7,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  sVar3 = std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::size(&local_28);
  printf("%d keys\n",sVar3 & 0xffffffff);
  bVar5 = 1;
  bVar1 = TestHashList<Blob<224>>
                    (in_stack_fffffffffffffcc0,(bool)in_stack_fffffffffffffcbf,
                     (bool)in_stack_fffffffffffffcbe,(bool)in_stack_fffffffffffffcbd,
                     (bool)in_stack_fffffffffffffcbc,(bool)in_stack_fffffffffffffcbb);
  bVar5 = bVar1 & bVar5;
  printf("\n");
  std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::~vector(in_stack_fffffffffffffbb0);
  return (bool)(bVar5 & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive, bool testColl, bool testDist, bool drawDiagram  )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits, inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashtype h;

    hash(&k,sizeof(keytype),0,&h);

    hashes.push_back(h);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}